

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mymock.hpp
# Opt level: O0

void __thiscall MyMock::MyMock(MyMock *this)

{
  anon_class_8_1_8991fb9c local_58;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c local_48;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c local_38;
  anon_class_8_1_8991fb9c local_30 [3];
  anon_class_8_1_8991fb9c local_18;
  MyMock *local_10;
  MyMock *this_local;
  
  local_10 = this;
  mockaron::detail::mock_impl::mock_impl(&this->super_mock_impl);
  (this->super_mock_impl)._vptr_mock_impl = (_func_int **)&PTR__MyMock_0011db68;
  this->z = 0;
  local_18.this = this;
  mockaron::detail::mock_impl::add_hook<int(int),int,MyMock::MyMock()::_lambda((auto:1&&)___)_1_>
            (&this->super_mock_impl,"f",&local_18);
  local_30[0].this = this;
  mockaron::detail::mock_impl::
  add_hook<int(int_const&),int,MyMock::MyMock()::_lambda((auto:1&&)___)_2_>
            (&this->super_mock_impl,"g",local_30);
  local_38.this = this;
  mockaron::detail::mock_impl::
  add_hook<float(float),float,MyMock::MyMock()::_lambda((auto:1&&)___)_3_>
            (&this->super_mock_impl,"g",&local_38);
  local_40.this = this;
  mockaron::detail::mock_impl::
  add_hook<int(int)const,int,MyMock::MyMock()::_lambda((auto:1&&)___)_4_>
            (&this->super_mock_impl,"h",&local_40);
  local_48.this = this;
  mockaron::detail::mock_impl::add_hook<int(),int,MyMock::MyMock()::_lambda((auto:1&&)___)_5_>
            (&this->super_mock_impl,"i",&local_48);
  local_50.this = this;
  mockaron::detail::mock_impl::add_hook<void(),void,MyMock::MyMock()::_lambda((auto:1&&)___)_6_>
            (&this->super_mock_impl,"j",&local_50);
  local_58.this = this;
  mockaron::detail::mock_impl::
  add_hook<My::NoCopy&(),My::NoCopy&,MyMock::MyMock()::_lambda((auto:1&&)___)_7_>
            (&this->super_mock_impl,"k",&local_58);
  return;
}

Assistant:

MyMock()
  {
    MOCKARON_DECLARE_IMPL(My, f);
    MOCKARON_DECLARE_IMPL_SIG(int(int const&), My, g);
    MOCKARON_DECLARE_IMPL_SIG(float(float), My, g);
    MOCKARON_DECLARE_IMPL(My, h);
    MOCKARON_DECLARE_IMPL(My, i);
    MOCKARON_DECLARE_IMPL(My, j);
    MOCKARON_DECLARE_IMPL(My, k);
  }